

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

int htmlSaveFile(char *filename,xmlDocPtr cur)

{
  xmlParserErrors xVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlOutputBufferPtr buf;
  xmlChar *name;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandler *local_20;
  
  local_20 = (xmlCharEncodingHandlerPtr)0x0;
  iVar2 = -1;
  if (filename != (char *)0x0 && cur != (xmlDocPtr)0x0) {
    xmlInitParser();
    pxVar3 = htmlGetMetaEncoding(cur);
    name = (xmlChar *)"HTML";
    if (pxVar3 != (xmlChar *)0x0) {
      name = pxVar3;
    }
    xVar1 = xmlOpenCharEncodingHandler((char *)name,1,&local_20);
    if (xVar1 == XML_ERR_OK) {
      buf = xmlOutputBufferCreateFilename(filename,local_20,cur->compression);
      if (buf != (xmlOutputBufferPtr)0x0) {
        htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,(char *)0x0,1);
        iVar2 = xmlOutputBufferClose(buf);
      }
    }
  }
  return iVar2;
}

Assistant:

int
htmlSaveFile(const char *filename, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    encoding = (const char *) htmlGetMetaEncoding(cur);
    if (htmlFindOutputEncoder(encoding, &handler) != XML_ERR_OK)
        return(-1);
    buf = xmlOutputBufferCreateFilename(filename, handler, cur->compression);
    if (buf == NULL)
        return(-1);

    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}